

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O3

int CVmObjCharSet::is_rt_mappable(wchar_t c,CCharmapToLocal *to_local,CCharmapToUni *to_uni)

{
  ulong uVar1;
  int iVar2;
  wchar_t wVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  uint uVar5;
  size_t unilen;
  char unibuf [16];
  char lclbuf [16];
  char *p;
  long local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 **local_38;
  
  uVar1 = (ulong)(uint)c;
  iVar2 = (*(to_local->super_CCharmap)._vptr_CCharmap[6])(to_local,uVar1);
  uVar5 = 0;
  if ((iVar2 != 0) &&
     ((to_local->exp_map_[(ulong)((uint)c >> 8) & 0xff] == (uint *)0x0 ||
      (to_local->exp_map_[(ulong)((uint)c >> 8) & 0xff][uVar1 & 0xff] == 0)))) {
    local_58[0] = local_48;
    local_60 = 0x10;
    iVar2 = (*(to_local->super_CCharmap)._vptr_CCharmap[2])(to_local,uVar1,local_58,&local_60);
    local_60 = 0x10;
    local_38 = local_58;
    iVar2 = (*(to_uni->super_CCharmap)._vptr_CCharmap[4])
                      (to_uni,&local_38,&local_60,local_48,CONCAT44(extraout_var,iVar2));
    local_60 = CONCAT44(extraout_var_00,iVar2);
    lVar4 = 1;
    if (L'\x7f' < c) {
      lVar4 = 3 - (ulong)((uint)c < 0x800);
    }
    if (local_60 == lVar4) {
      wVar3 = utf8_ptr::s_getch((char *)local_58);
      uVar5 = (uint)(wVar3 == c);
    }
  }
  return uVar5;
}

Assistant:

int CVmObjCharSet::is_rt_mappable(wchar_t c, CCharmapToLocal *to_local,
                                  CCharmapToUni *to_uni)
{
    char lclbuf[16];
    char unibuf[16];
    size_t lcllen;
    size_t unilen;
    char *p;

    /* if there's no local mapping, it's obviously not mappable */
    if (!to_local->is_mappable(c))
        return FALSE;

    /* 
     *   If there's an expansion in the mapping to the local set, then there
     *   can't be a round-trip mapping.  Expansions are inherently one-way
     *   because they produce multiple local characters for a single unicode
     *   character, and the reverse mapping has no way to group those
     *   multiple local characters back into a single unicode character.  
     */
    if (to_local->get_expansion(c, &lcllen) != 0)
        return FALSE;

    /* get the local mapping */
    lcllen = to_local->map_char(c, lclbuf, sizeof(lclbuf));

    /* map it back to unicode */
    p = unibuf;
    unilen = sizeof(unibuf);
    unilen = to_uni->map(&p, &unilen, lclbuf, lcllen);

    /* 
     *   if the unicode mapping is one character that exactly matches the
     *   original input character, then we have a valid round-trip mapping 
     */
    return (unilen == utf8_ptr::s_wchar_size(c)
            && utf8_ptr::s_getch(unibuf) == c);
}